

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaV_concat(lua_State *L,int total,int last)

{
  Table *pTVar1;
  size_t __n;
  int iVar2;
  StkId obj;
  char *str;
  GCObject *pGVar3;
  bool bVar4;
  TValue *i_o;
  size_t l_1;
  size_t l;
  int i;
  char *buffer;
  size_t tl;
  int n;
  StkId top;
  int last_local;
  int total_local;
  lua_State *L_local;
  
  top._0_4_ = last;
  top._4_4_ = total;
  do {
    obj = L->base + (int)top;
    tl._4_4_ = 2;
    if (((obj[-1].tt == 4) || (obj[-1].tt == 3)) &&
       ((obj->tt == 4 || (iVar2 = luaV_tostring(L,obj), iVar2 != 0)))) {
      if ((((obj->value).gc)->h).metatable == (Table *)0x0) {
        if (obj[-1].tt != 4) {
          luaV_tostring(L,obj + -1);
        }
      }
      else {
        buffer = (char *)(((obj->value).gc)->h).metatable;
        tl._4_4_ = 1;
        while( true ) {
          bVar4 = false;
          if ((tl._4_4_ < top._4_4_) && (bVar4 = true, obj[-(long)tl._4_4_].tt != 4)) {
            iVar2 = luaV_tostring(L,obj + -(long)tl._4_4_);
            bVar4 = iVar2 != 0;
          }
          if (!bVar4) break;
          pTVar1 = ((obj[-(long)tl._4_4_].value.gc)->h).metatable;
          if ((Table *)(-3 - (long)buffer) <= pTVar1) {
            luaG_runerror(L,"string length overflow");
          }
          buffer = buffer + (long)pTVar1;
          tl._4_4_ = tl._4_4_ + 1;
        }
        str = luaZ_openspace(L,&L->l_G->buff,(size_t)buffer);
        buffer = (char *)0x0;
        for (l._4_4_ = tl._4_4_; 0 < l._4_4_; l._4_4_ = l._4_4_ + -1) {
          __n = *(size_t *)((long)obj[1 - (long)l._4_4_].value.gc + 0x10);
          memcpy(str + (long)buffer,&((obj[1 - (long)l._4_4_].value.gc)->h).array,__n);
          buffer = buffer + __n;
        }
        pGVar3 = (GCObject *)luaS_newlstr(L,str,(size_t)buffer);
        obj[1 - (long)tl._4_4_].value.gc = pGVar3;
        obj[1 - (long)tl._4_4_].tt = 4;
      }
    }
    else {
      iVar2 = call_binTM(L,obj + -1,obj,obj + -1,TM_CONCAT);
      if (iVar2 == 0) {
        luaG_concaterror(L,obj + -1,obj);
      }
    }
    top._4_4_ = top._4_4_ - (tl._4_4_ + -1);
    top._0_4_ = (int)top - (tl._4_4_ + -1);
  } while (1 < top._4_4_);
  return;
}

Assistant:

static void luaV_concat(lua_State*L,int total,int last){
do{
StkId top=L->base+last+1;
int n=2;
if(!(ttisstring(top-2)||ttisnumber(top-2))||!tostring(L,top-1)){
if(!call_binTM(L,top-2,top-1,top-2,TM_CONCAT))
luaG_concaterror(L,top-2,top-1);
}else if(tsvalue(top-1)->len==0)
(void)tostring(L,top-2);
else{
size_t tl=tsvalue(top-1)->len;
char*buffer;
int i;
for(n=1;n<total&&tostring(L,top-n-1);n++){
size_t l=tsvalue(top-n-1)->len;
if(l>=((size_t)(~(size_t)0)-2)-tl)luaG_runerror(L,"string length overflow");
tl+=l;
}
buffer=luaZ_openspace(L,&G(L)->buff,tl);
tl=0;
for(i=n;i>0;i--){
size_t l=tsvalue(top-i)->len;
memcpy(buffer+tl,svalue(top-i),l);
tl+=l;
}
setsvalue(L,top-n,luaS_newlstr(L,buffer,tl));
}
total-=n-1;
last-=n-1;
}while(total>1);
}